

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void av1_build_prediction_by_left_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  uint uVar1;
  int iVar2;
  MB_MODE_INFO **ppMVar3;
  byte bVar4;
  byte op_mi_size;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  MB_MODE_INFO *above_mbmi;
  int iVar9;
  uint uVar10;
  bool bVar11;
  build_prediction_ctxt ctxt;
  
  if (xd->left_available == true) {
    ctxt.mb_to_far_edge = xd->mb_to_bottom_edge;
    ctxt.dcb = (void *)0x0;
    ppMVar3 = xd->mi;
    bVar11 = cm->seq_params->monochrome == '\0';
    uVar1 = xd->mi_row;
    iVar8 = xd->height + uVar1;
    iVar2 = (cm->mi_params).mi_rows;
    if (iVar2 <= iVar8) {
      iVar8 = iVar2;
    }
    if (((0x3dfffaUL >> ((ulong)(*ppMVar3)->bsize & 0x3f) & 1) != 0) && ((int)uVar1 < iVar8)) {
      iVar2 = max_neighbor_obmc[""[(*ppMVar3)->bsize]];
      lVar5 = (long)xd->mi_stride * (long)(int)uVar1;
      iVar9 = 0;
      ctxt.cm = cm;
      ctxt.tmp_buf = tmp_buf;
      ctxt.tmp_width = tmp_width;
      ctxt.tmp_height = tmp_height;
      ctxt.tmp_stride = tmp_stride;
      uVar10 = uVar1;
      do {
        above_mbmi = ppMVar3[((long)(int)(xd->mi_stride * uVar10) + -1) - lVar5];
        uVar7 = (ulong)above_mbmi->bsize;
        bVar4 = 0x10;
        uVar6 = uVar10;
        if ((0x2f0bffUL >> (uVar7 & 0x3f) & 1) != 0) {
          if ((0x20005UL >> (uVar7 & 0x3f) & 1) == 0) {
            bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [uVar7];
          }
          else {
            uVar6 = uVar10 & 0xfffffffe;
            above_mbmi = ppMVar3[((long)(int)(xd->mi_stride * (uVar10 | 1)) + -1) - lVar5];
            bVar4 = 2;
          }
        }
        if (((above_mbmi->field_0xa7 & 0x80) != 0) || ('\0' < above_mbmi->ref_frame[0])) {
          iVar9 = iVar9 + 1;
          op_mi_size = xd->height;
          if (bVar4 <= xd->height) {
            op_mi_size = bVar4;
          }
          build_obmc_prediction
                    (xd,uVar6 - uVar1,0,op_mi_size,1,above_mbmi,&ctxt,bVar11 + 1 + (uint)bVar11);
        }
        uVar10 = uVar6 + bVar4;
      } while (((int)uVar10 < iVar8) && (iVar9 < iVar2));
    }
  }
  return;
}

Assistant:

void av1_build_prediction_by_left_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                        uint8_t *tmp_buf[MAX_MB_PLANE],
                                        int tmp_width[MAX_MB_PLANE],
                                        int tmp_height[MAX_MB_PLANE],
                                        int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->left_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_bottom_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_prediction, &ctxt);
}